

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceIntersection.cpp
# Opt level: O0

int GeoCalcs::DistanceIntersection
              (LLPoint *pt1,double dist13,LLPoint *pt2,double dist23,LLPoint *intPtC1,
              LLPoint *intPtC2,double dTol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  LLPoint LVar6;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double A;
  double sinC_R;
  double sinB_R;
  double cosC_R;
  double cosB_R;
  double cosA_R;
  double local_78;
  double crs12;
  double dist12;
  InverseResult result;
  double dTol_local;
  LLPoint *intPtC2_local;
  LLPoint *intPtC1_local;
  double dist23_local;
  LLPoint *pt2_local;
  double dist13_local;
  LLPoint *pt1_local;
  
  result.distance = dTol;
  INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)&dist12);
  DistVincenty(pt1,pt2,(InverseResult *)&dist12);
  if ((((dist13 + dist23) - result.reverseAzimuth) + result.distance < 0.0) ||
     (result.reverseAzimuth < ABS(dist13 - dist23))) {
    pt1_local._4_4_ = 0;
  }
  else if (result.distance < ABS((dist13 + dist23) - result.reverseAzimuth)) {
    dVar1 = cos(dist23 / kSphereRadius);
    dVar2 = cos(dist13 / kSphereRadius);
    dVar3 = cos(result.reverseAzimuth / kSphereRadius);
    dVar4 = sin(dist13 / kSphereRadius);
    dVar5 = sin(result.reverseAzimuth / kSphereRadius);
    dVar1 = acos((-dVar2 * dVar3 + dVar1) / (dVar4 * dVar5));
    LVar6 = DestVincenty(pt1,dist12 - dVar1,dist13);
    local_c0 = LVar6.latitude;
    intPtC1->latitude = local_c0;
    local_b8 = LVar6.longitude;
    intPtC1->longitude = local_b8;
    LVar6 = DestVincenty(pt1,dist12 + dVar1,dist13);
    local_d0 = LVar6.latitude;
    intPtC2->latitude = local_d0;
    local_c8 = LVar6.longitude;
    intPtC2->longitude = local_c8;
    pt1_local._4_4_ = 2;
  }
  else {
    LVar6 = DestVincenty(pt1,dist12,dist13);
    cosA_R = LVar6.latitude;
    intPtC1->latitude = cosA_R;
    local_78 = LVar6.longitude;
    intPtC1->longitude = local_78;
    pt1_local._4_4_ = 1;
  }
  return pt1_local._4_4_;
}

Assistant:

int DistanceIntersection(const LLPoint &pt1, double dist13, const LLPoint &pt2, double dist23,
                             LLPoint &intPtC1, LLPoint &intPtC2, double dTol)
    {
        InverseResult result;
        DistVincenty(pt1, pt2, result);
        const double dist12 = result.distance;
        const double crs12 = result.azimuth;

        if ((dist13 + dist23 - dist12 + dTol < 0) ||
            fabs(dist13 - dist23) > dist12)
            return 0;
        if (fabs(dist13 + dist23 - dist12) <= dTol)
        {
            intPtC1 = DestVincenty(pt1, crs12, dist13);
            return 1;
        }

        const double cosA_R = cos(dist23 / kSphereRadius);
        const double cosB_R = cos(dist13 / kSphereRadius);
        const double cosC_R = cos(dist12 / kSphereRadius);
        const double sinB_R = sin(dist13 / kSphereRadius);
        const double sinC_R = sin(dist12 / kSphereRadius);
        const double A = acos((cosA_R - cosB_R * cosC_R) / (sinB_R * sinC_R));

        intPtC1 = DestVincenty(pt1, crs12 - A, dist13);
        intPtC2 = DestVincenty(pt1, crs12 + A, dist13);

        return 2;
    }